

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall QGridLayoutPrivate::addHfwData(QGridLayoutPrivate *this,QGridBox *box,int width)

{
  bool bVar1;
  const_reference pQVar2;
  int *piVar3;
  reference pQVar4;
  long in_FS_OFFSET;
  QList<QLayoutStruct> *rData;
  QSize minS;
  QSize hint_1;
  int hint;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar5;
  int in_stack_ffffffffffffffac;
  int iVar6;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_24;
  int local_20;
  QSize local_1c;
  QSize local_14;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QGridBox::hasHeightForWidth((QGridBox *)0x3340de);
  if (bVar1) {
    local_c = QGridBox::heightForWidth
                        ((QGridBox *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
    pQVar2 = QList<QLayoutStruct>::at
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    piVar3 = qMax<int>(&local_c,&pQVar2->sizeHint);
    iVar5 = *piVar3;
    pQVar4 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(in_stack_ffffffffffffffb4,iVar5),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    pQVar4->sizeHint = iVar5;
    pQVar2 = QList<QLayoutStruct>::at
                       ((QList<QLayoutStruct> *)CONCAT44(in_stack_ffffffffffffffb4,iVar5),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    piVar3 = qMax<int>(&local_c,&pQVar2->minimumSize);
    iVar6 = *piVar3;
    pQVar4 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)CONCAT44(iVar6,iVar5),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    pQVar4->minimumSize = iVar6;
  }
  else {
    local_14 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_14 = QGridBox::sizeHint((QGridBox *)
                                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_1c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_1c = QGridBox::minimumSize
                         ((QGridBox *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
    ;
    local_20 = QSize::height((QSize *)0x3341c6);
    pQVar2 = QList<QLayoutStruct>::at
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    piVar3 = qMax<int>(&local_20,&pQVar2->sizeHint);
    iVar5 = *piVar3;
    pQVar4 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(in_stack_ffffffffffffffac,iVar5));
    pQVar4->sizeHint = iVar5;
    local_24 = QSize::height((QSize *)0x334216);
    pQVar2 = QList<QLayoutStruct>::at
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(in_stack_ffffffffffffffac,iVar5));
    piVar3 = qMax<int>(&local_24,&pQVar2->minimumSize);
    iVar6 = *piVar3;
    pQVar4 = QList<QLayoutStruct>::operator[]
                       ((QList<QLayoutStruct> *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(iVar6,iVar5));
    pQVar4->minimumSize = iVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayoutPrivate::addHfwData(QGridBox *box, int width)
{
    QList<QLayoutStruct> &rData = *hfwData;
    if (box->hasHeightForWidth()) {
        int hint = box->heightForWidth(width);
        rData[box->row].sizeHint = qMax(hint, rData.at(box->row).sizeHint);
        rData[box->row].minimumSize = qMax(hint, rData.at(box->row).minimumSize);
    } else {
        QSize hint = box->sizeHint();
        QSize minS = box->minimumSize();
        rData[box->row].sizeHint = qMax(hint.height(), rData.at(box->row).sizeHint);
        rData[box->row].minimumSize = qMax(minS.height(), rData.at(box->row).minimumSize);
    }
}